

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::emit_struct_padding_target(CompilerMSL *this,SPIRType *type)

{
  uint32_t uVar1;
  uint32_t uVar2;
  CompilerError *this_00;
  allocator local_39;
  string local_38;
  
  uVar1 = get_declared_struct_size_msl(this,type,true,true);
  uVar2 = Compiler::get_extended_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,
                     SPIRVCrossDecorationPaddingTarget);
  local_38._M_dataplus._M_p._0_4_ = uVar2 - uVar1;
  if (uVar1 <= uVar2) {
    if (uVar1 <= uVar2 && (int)local_38._M_dataplus._M_p != 0) {
      CompilerGLSL::statement<char_const(&)[24],unsigned_int,char_const(&)[3]>
                (&this->super_CompilerGLSL,(char (*) [24])"char _m0_final_padding[",
                 (uint *)&local_38,(char (*) [3])0x3a0fd0);
    }
    return;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"Cannot pad with negative bytes.",&local_39);
  CompilerError::CompilerError(this_00,&local_38);
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerMSL::emit_struct_padding_target(const SPIRType &type)
{
	uint32_t struct_size = get_declared_struct_size_msl(type, true, true);
	uint32_t target_size = get_extended_decoration(type.self, SPIRVCrossDecorationPaddingTarget);
	if (target_size < struct_size)
		SPIRV_CROSS_THROW("Cannot pad with negative bytes.");
	else if (target_size > struct_size)
		statement("char _m0_final_padding[", target_size - struct_size, "];");
}